

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

void __thiscall GlobOpt::PreparePropertySymForTypeCheckSeq(GlobOpt *this,PropertySym *propertySym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *objectSym;
  
  objectSym = propertySym->m_stackSym;
  if ((objectSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x30e,"(!propertySym->m_stackSym->IsTypeSpec())",
                       "!propertySym->m_stackSym->IsTypeSpec()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    objectSym = propertySym->m_stackSym;
  }
  EnsureObjectTypeSym(this,objectSym);
  EnsurePropertyWriteGuardSym(this,propertySym);
  return;
}

Assistant:

void
GlobOpt::PreparePropertySymForTypeCheckSeq(PropertySym *propertySym)
{
    Assert(!propertySym->m_stackSym->IsTypeSpec());
    EnsureObjectTypeSym(propertySym->m_stackSym);
    EnsurePropertyWriteGuardSym(propertySym);
}